

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::OneofDescriptorTest::SetUp(OneofDescriptorTest *this)

{
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *this_00;
  int iVar1;
  uint uVar2;
  Descriptor *pDVar3;
  OneofDescriptor *pOVar4;
  FieldDescriptor *pFVar5;
  DescriptorProto *parent;
  void *pvVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar7;
  FileDescriptor *pFVar8;
  Nonnull<const_char_*> pcVar9;
  Arena *pAVar10;
  long lVar11;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  pointer pcVar12;
  char *in_R9;
  pointer *__ptr;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  FileDescriptorProto baz_file;
  undefined1 local_158 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  AssertHelper local_138;
  Message local_130;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_128;
  AssertHelper local_120;
  undefined1 local_118 [208];
  ArenaStringPtr local_48 [5];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_118,(Arena *)0x0);
  local_118[0x10] = local_118[0x10] | 1;
  pAVar10 = (Arena *)local_118._8_8_;
  if ((local_118._8_8_ & 1) != 0) {
    pAVar10 = *(Arena **)(local_118._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "baz.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_118 + 200),value,pAVar10);
  local_118[0x10] = local_118[0x10] | 2;
  if ((local_118._8_8_ & 1) != 0) {
    local_118._8_8_ = *(undefined8 *)(local_118._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "garply";
  value_00._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set(local_48,value_00,(Arena *)local_118._8_8_);
  local_158 = (undefined1  [8])&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"TestOneof","");
  parent = AddMessage((FileDescriptorProto *)local_118,(string *)local_158);
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
  }
  this_00 = &(parent->field_0)._impl_.oneof_decl_;
  pvVar6 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::OneofDescriptorProto>);
  *(byte *)((long)pvVar6 + 0x10) = *(byte *)((long)pvVar6 + 0x10) | 1;
  pAVar10 = *(Arena **)((long)pvVar6 + 8);
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  value_01._M_str = "foo";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar6 + 0x18),value_01,pAVar10);
  pvVar6 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&this_00->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::OneofDescriptorProto>);
  *(byte *)((long)pvVar6 + 0x10) = *(byte *)((long)pvVar6 + 0x10) | 1;
  pAVar10 = *(Arena **)((long)pvVar6 + 8);
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  value_02._M_str = "bar";
  value_02._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar6 + 0x18),value_02,pAVar10);
  local_158 = (undefined1  [8])&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"a","");
  AddField(parent,(string *)local_158,1,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_INT32);
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
  }
  local_158 = (undefined1  [8])&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"b","");
  AddField(parent,(string *)local_158,2,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_STRING);
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
  }
  this_02 = &(parent->field_0)._impl_.field_;
  pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,1);
  (pVVar7->field_0)._impl_.oneof_index_ = 0;
  *(byte *)&pVVar7->field_0 = *(byte *)&pVVar7->field_0 | 0x80;
  local_158 = (undefined1  [8])&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"c","");
  AddField(parent,(string *)local_158,3,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_MESSAGE);
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
  }
  pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,2);
  (pVVar7->field_0)._impl_.oneof_index_ = 0;
  *(byte *)&pVVar7->field_0 = *(byte *)&pVVar7->field_0 | 0x80;
  pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,2);
  *(byte *)&pVVar7->field_0 = *(byte *)&pVVar7->field_0 | 4;
  pAVar10 = (Arena *)(pVVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  value_03._M_str = "TestOneof";
  value_03._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set(&(pVVar7->field_0)._impl_.type_name_,value_03,pAVar10);
  local_158 = (undefined1  [8])&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"d","");
  AddField(parent,(string *)local_158,4,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_FLOAT);
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
  }
  pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,3);
  (pVVar7->field_0)._impl_.oneof_index_ = 1;
  *(byte *)&pVVar7->field_0 = *(byte *)&pVVar7->field_0 | 0x80;
  pFVar8 = DescriptorPool::BuildFile(&this->pool_,(FileDescriptorProto *)local_118);
  this->baz_file_ = pFVar8;
  local_130.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_130.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,pFVar8 != (FileDescriptor *)0x0);
  local_128._M_head_impl = (LogMessageData *)0x0;
  if (pFVar8 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_138);
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_128;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)&local_130,(AssertionResult *)"baz_file_ != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x59f,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_158 != (undefined1  [8])&local_148) {
      operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_138.data_._4_4_,(int)local_138.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138.data_._4_4_,(int)local_138.data_) + 8))();
    }
    local_150._M_head_impl = local_128._M_head_impl;
    if (local_128._M_head_impl == (LogMessageData *)0x0) goto LAB_005f6d1c;
  }
  else {
    local_130.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    local_138.data_._0_4_ = pFVar8->message_type_count_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_158,"1","baz_file_->message_type_count()",(int *)&local_130,
               (int *)&local_138);
    if (local_158[0] == (internal)0x0) {
      testing::Message::Message(&local_130);
      if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
          local_150._M_head_impl ==
          (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
          0x0) {
        pcVar12 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar12 = (pointer)((local_150._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x5a1,pcVar12);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
    }
    else {
      if (local_150._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_150._M_head_impl);
      }
      lVar11 = (long)this->baz_file_->message_type_count_;
      if (lVar11 < 1) {
        pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (0,lVar11,"index < message_type_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_158,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xae7,pcVar9);
        goto LAB_005f6ea7;
      }
      pDVar3 = this->baz_file_->message_types_;
      this->oneof_message_ = pDVar3;
      local_130.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 2;
      local_138.data_._0_4_ = pDVar3->oneof_decl_count_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_158,"2","oneof_message_->oneof_decl_count()",(int *)&local_130,
                 (int *)&local_138);
      if (local_158[0] == (internal)0x0) {
        testing::Message::Message(&local_130);
        if (local_150._M_head_impl == (LogMessageData *)0x0) {
          pcVar12 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar12 = (pointer)((local_150._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x5a4,pcVar12);
        testing::internal::AssertHelper::operator=(&local_138,&local_130);
      }
      else {
        if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )local_150._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150._M_head_impl);
        }
        pDVar3 = this->oneof_message_;
        iVar1 = pDVar3->oneof_decl_count_;
        if ((long)iVar1 < 1) {
          pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (0,(long)iVar1,"index < oneof_decl_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_158,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa89,pcVar9);
LAB_005f6ea7:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_158);
        }
        pOVar4 = pDVar3->oneof_decls_;
        this->oneof_ = pOVar4;
        if (iVar1 == 1) {
          pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (1,1,"index < oneof_decl_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_158,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa89,pcVar9);
          goto LAB_005f6ea7;
        }
        this->oneof2_ = pOVar4 + 1;
        local_130.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 4;
        local_138.data_._0_4_ = pDVar3->field_count_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_158,"4","oneof_message_->field_count()",(int *)&local_130,
                   (int *)&local_138);
        if (local_158[0] != (internal)0x0) {
          if (local_150._M_head_impl != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150._M_head_impl);
          }
          uVar2 = this->oneof_message_->field_count_;
          lVar11 = (long)(int)uVar2;
          if (lVar11 < 1) {
            pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (0,lVar11,"index < field_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_158,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar9);
          }
          else {
            pFVar5 = this->oneof_message_->fields_;
            this->a_ = pFVar5;
            if (uVar2 == 1) {
              pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (1,1,"index < field_count()");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_158,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xa88,pcVar9);
            }
            else {
              this->b_ = pFVar5 + 1;
              if (uVar2 < 3) {
                pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (2,lVar11,"index < field_count()");
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_158,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xa88,pcVar9);
              }
              else {
                this->c_ = pFVar5 + 2;
                if (uVar2 != 3) {
                  this->d_ = pFVar5 + 3;
                  goto LAB_005f6d1c;
                }
                pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (3,3,"index < field_count()");
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_158,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xa88,pcVar9);
              }
            }
          }
          goto LAB_005f6ea7;
        }
        testing::Message::Message(&local_130);
        if (local_150._M_head_impl == (LogMessageData *)0x0) {
          pcVar12 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar12 = (pointer)((local_150._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x5a8,pcVar12);
        testing::internal::AssertHelper::operator=(&local_138,&local_130);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((long *)CONCAT44(local_130.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_130.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_130.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_130.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_150._M_head_impl ==
        (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0)
    goto LAB_005f6d1c;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_150;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_150._M_head_impl);
LAB_005f6d1c:
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  return;
}

Assistant:

void SetUp() override {
    // Build descriptors for the following definitions:
    //
    //   package garply;
    //   message TestOneof {
    //     optional int32 a = 1;
    //     oneof foo {
    //       string b = 2;
    //       TestOneof c = 3;
    //     }
    //     oneof bar {
    //       float d = 4;
    //     }
    //   }

    FileDescriptorProto baz_file;
    baz_file.set_name("baz.proto");
    baz_file.set_package("garply");

    DescriptorProto* oneof_message = AddMessage(&baz_file, "TestOneof");
    oneof_message->add_oneof_decl()->set_name("foo");
    oneof_message->add_oneof_decl()->set_name("bar");

    AddField(oneof_message, "a", 1, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_INT32);
    AddField(oneof_message, "b", 2, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_STRING);
    oneof_message->mutable_field(1)->set_oneof_index(0);
    AddField(oneof_message, "c", 3, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_MESSAGE);
    oneof_message->mutable_field(2)->set_oneof_index(0);
    oneof_message->mutable_field(2)->set_type_name("TestOneof");

    AddField(oneof_message, "d", 4, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_FLOAT);
    oneof_message->mutable_field(3)->set_oneof_index(1);

    // Build the descriptors and get the pointers.
    baz_file_ = pool_.BuildFile(baz_file);
    ASSERT_TRUE(baz_file_ != nullptr);

    ASSERT_EQ(1, baz_file_->message_type_count());
    oneof_message_ = baz_file_->message_type(0);

    ASSERT_EQ(2, oneof_message_->oneof_decl_count());
    oneof_ = oneof_message_->oneof_decl(0);
    oneof2_ = oneof_message_->oneof_decl(1);

    ASSERT_EQ(4, oneof_message_->field_count());
    a_ = oneof_message_->field(0);
    b_ = oneof_message_->field(1);
    c_ = oneof_message_->field(2);
    d_ = oneof_message_->field(3);
  }